

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception-test.c++
# Opt level: O0

void __thiscall kj::_::anon_unknown_0::TestCase141::run(TestCase141 *this)

{
  undefined4 *puVar1;
  Type *func;
  Type *func_00;
  Type *func_01;
  Type *func_02;
  bool _kj_shouldLog_7;
  bool _kj_shouldLog_6;
  int anon_var_4;
  bool _kj_shouldLog_5;
  bool _kj_shouldLog_4;
  undefined1 *local_d8;
  undefined1 local_d0 [8];
  Deferred<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_exception_test_c__:161:5)>
  _kjDefer161;
  bool *pbStack_b0;
  UnwindDetector _kjUnwindDetector161;
  undefined1 local_a0 [8];
  Deferred<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_exception_test_c__:160:5)>
  _kjDefer160;
  UnwindDetector _kjUnwindDetector160;
  bool _kj_shouldLog_3;
  bool _kj_shouldLog_2;
  bool _kj_shouldLog_1;
  bool _kj_shouldLog;
  undefined1 local_70 [8];
  Deferred<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_exception_test_c__:147:5)>
  _kjDefer147;
  UnwindDetector local_44;
  bool *pbStack_40;
  UnwindDetector _kjUnwindDetector147;
  undefined1 local_30 [8];
  Deferred<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_exception_test_c__:146:5)>
  _kjDefer146;
  UnwindDetector _kjUnwindDetector146;
  bool failure;
  bool success;
  TestCase141 *this_local;
  
  _kjDefer146._23_1_ = 0;
  _kjDefer146._22_1_ = 0;
  UnwindDetector::UnwindDetector((UnwindDetector *)&_kjDefer146.canceled);
  pbStack_40 = &_kjDefer146.canceled;
  defer<kj::_::(anonymous_namespace)::TestCase141::run()::__0>
            ((Deferred<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_exception_test_c__:146:5)>
              *)local_30,(kj *)&stack0xffffffffffffffc0,func);
  UnwindDetector::UnwindDetector(&local_44);
  __kjUnwindDetector160 = &local_44;
  defer<kj::_::(anonymous_namespace)::TestCase141::run()::__1>
            ((Deferred<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_exception_test_c__:147:5)>
              *)local_70,(kj *)&_kjUnwindDetector160,func_00);
  if ((_kjDefer146._23_1_ & 1) != 0) {
    _kjDefer160._23_1_ = Debug::shouldLog(ERROR);
    while (_kjDefer160._23_1_ != '\0') {
      Debug::log<char_const(&)[28]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/exception-test.c++"
                 ,0x95,ERROR,"\"failed: expected \" \"!(success)\"",
                 (char (*) [28])"failed: expected !(success)");
      _kjDefer160._23_1_ = 0;
    }
  }
  if ((_kjDefer146._22_1_ & 1) != 0) {
    _kjDefer160._22_1_ = Debug::shouldLog(ERROR);
    while (_kjDefer160._22_1_ != '\0') {
      Debug::log<char_const(&)[28]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/exception-test.c++"
                 ,0x96,ERROR,"\"failed: expected \" \"!(failure)\"",
                 (char (*) [28])"failed: expected !(failure)");
      _kjDefer160._22_1_ = 0;
    }
  }
  Deferred<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/exception-test.c++:147:5)>
  ::~Deferred((Deferred<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_exception_test_c__:147:5)>
               *)local_70);
  Deferred<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/exception-test.c++:146:5)>
  ::~Deferred((Deferred<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_exception_test_c__:146:5)>
               *)local_30);
  if ((_kjDefer146._23_1_ & 1) == 0) {
    _kjDefer160._21_1_ = Debug::shouldLog(ERROR);
    while (_kjDefer160._21_1_ != '\0') {
      Debug::log<char_const(&)[25]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/exception-test.c++"
                 ,0x99,ERROR,"\"failed: expected \" \"success\"",
                 (char (*) [25])"failed: expected success");
      _kjDefer160._21_1_ = 0;
    }
  }
  if ((_kjDefer146._22_1_ & 1) != 0) {
    _kjDefer160._20_1_ = Debug::shouldLog(ERROR);
    while (_kjDefer160._20_1_ != '\0') {
      Debug::log<char_const(&)[28]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/exception-test.c++"
                 ,0x9a,ERROR,"\"failed: expected \" \"!(failure)\"",
                 (char (*) [28])"failed: expected !(failure)");
      _kjDefer160._20_1_ = 0;
    }
  }
  _kjDefer146._23_1_ = 0;
  _kjDefer146._22_1_ = 0;
  UnwindDetector::UnwindDetector((UnwindDetector *)&_kjDefer160.canceled);
  pbStack_b0 = &_kjDefer160.canceled;
  defer<kj::_::(anonymous_namespace)::TestCase141::run()::__2>
            ((Deferred<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_exception_test_c__:160:5)>
              *)local_a0,(kj *)&stack0xffffffffffffff50,func_01);
  UnwindDetector::UnwindDetector((UnwindDetector *)&_kjDefer161.field_0x14);
  _anon_var_4 = &_kjDefer161.field_0x14;
  local_d8 = &_kjDefer146.field_0x16;
  defer<kj::_::(anonymous_namespace)::TestCase141::run()::__3>
            ((Deferred<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_exception_test_c__:161:5)>
              *)local_d0,(kj *)&anon_var_4,func_02);
  if ((_kjDefer146._23_1_ & 1) != 0) {
    _kj_shouldLog_6 = Debug::shouldLog(ERROR);
    while (_kj_shouldLog_6 != false) {
      Debug::log<char_const(&)[28]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/exception-test.c++"
                 ,0xa3,ERROR,"\"failed: expected \" \"!(success)\"",
                 (char (*) [28])"failed: expected !(success)");
      _kj_shouldLog_6 = false;
    }
  }
  if ((_kjDefer146._22_1_ & 1) != 0) {
    _kj_shouldLog_7 = Debug::shouldLog(ERROR);
    while (_kj_shouldLog_7 != false) {
      Debug::log<char_const(&)[28]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/exception-test.c++"
                 ,0xa4,ERROR,"\"failed: expected \" \"!(failure)\"",
                 (char (*) [28])"failed: expected !(failure)");
      _kj_shouldLog_7 = false;
    }
  }
  puVar1 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar1 = 1;
  __cxa_throw(puVar1,&int::typeinfo,0);
}

Assistant:

TEST(Exception, ScopeSuccessFail) {
  bool success = false;
  bool failure = false;

  {
    KJ_ON_SCOPE_SUCCESS(success = true);
    KJ_ON_SCOPE_FAILURE(failure = true);

    EXPECT_FALSE(success);
    EXPECT_FALSE(failure);
  }

  EXPECT_TRUE(success);
  EXPECT_FALSE(failure);

  success = false;
  failure = false;

  try {
    KJ_ON_SCOPE_SUCCESS(success = true);
    KJ_ON_SCOPE_FAILURE(failure = true);

    EXPECT_FALSE(success);
    EXPECT_FALSE(failure);

    throw 1;
  } catch (int) {}

  EXPECT_FALSE(success);
  EXPECT_TRUE(failure);
}